

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O3

void dfft_redistribute_block_to_cyclic_1d
               (int *dim,int *pdim,int ndim,int current_dim,int c0,int c1,int *pidx,int size_in,
               int *embed,cpx_t *work,cpx_t *scratch,int *dfft_nsend,int *dfft_nrecv,
               int *dfft_offset_send,int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  cpx_t *pcVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  cpx_t *pcVar10;
  int iVar11;
  int iVar12;
  cpx_t *pcVar13;
  int iVar14;
  cpx_t *pcVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  
  if (c0 == c1) {
    return;
  }
  uVar17 = (long)dim[current_dim] / (long)pdim[current_dim] & 0xffffffff;
  iVar14 = embed[current_dim];
  iVar1 = pidx[current_dim];
  iVar21 = (int)((long)dim[current_dim] / (long)pdim[current_dim]);
  uVar2 = (uint)((long)((ulong)(uint)(iVar21 >> 0x1f) << 0x20 | uVar17) / (long)(c1 / c0));
  uVar8 = 1;
  if ((int)uVar2 < 2) {
    uVar2 = 1;
  }
  uVar17 = (long)((ulong)(uint)(iVar21 >> 0x1f) << 0x20 | uVar17) / (long)(int)uVar2;
  iVar3 = (int)uVar17;
  uVar22 = (ulong)(uint)ndim;
  if (0 < ndim) {
    uVar5 = 0;
    do {
      uVar7 = (int)uVar8 * pdim[uVar5];
      uVar8 = (ulong)uVar7;
      uVar5 = uVar5 + 1;
    } while (uVar22 != uVar5);
    if ((int)uVar7 < 1) goto LAB_00101eff;
  }
  uVar5 = 0;
  do {
    dfft_nsend[uVar5] = 0;
    dfft_nrecv[uVar5] = 0;
    dfft_offset_send[uVar5] = 0;
    dfft_offset_recv[uVar5] = 0;
    uVar5 = uVar5 + 1;
  } while (uVar8 != uVar5);
LAB_00101eff:
  if (0 < iVar3) {
    iVar16 = (int)((long)size_in / (long)iVar14);
    iVar12 = uVar2 * iVar16;
    uVar8 = (ulong)(uint)current_dim;
    lVar9 = (long)iVar16;
    uVar5 = 0;
    pcVar13 = work;
    pcVar15 = scratch;
    do {
      iVar18 = (int)uVar5 * c0 + (iVar1 - iVar1 % c0) * iVar21 + iVar1 % c0;
      iVar18 = iVar18 % c1 + (iVar18 / (iVar21 * c1)) * c1;
      if (row_m == 0) {
        if (ndim < 1) goto LAB_0010205b;
        uVar20 = 0;
        iVar4 = 0;
        do {
          iVar11 = iVar18;
          if (uVar8 != uVar20) {
            iVar11 = pidx[uVar20];
          }
          iVar4 = iVar4 * pdim[uVar20] + iVar11;
          uVar20 = uVar20 + 1;
        } while (uVar22 != uVar20);
      }
      else if (ndim < 1) {
LAB_0010205b:
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        lVar19 = uVar22 + 1;
        do {
          iVar11 = iVar18;
          if (lVar19 - uVar8 != 2) {
            iVar11 = pidx[lVar19 + -2];
          }
          iVar4 = iVar4 * pdim[lVar19 + -2] + iVar11;
          lVar19 = lVar19 + -1;
        } while (1 < lVar19);
      }
      iVar18 = proc_map[iVar4];
      dfft_nsend[iVar18] = iVar12 * 8;
      dfft_offset_send[iVar18] = (int)uVar5 * iVar12 * 8;
      uVar20 = 0;
      pcVar6 = pcVar15;
      pcVar10 = pcVar13;
      do {
        if (0 < iVar16) {
          uVar23 = 0;
          do {
            pcVar6[uVar23] = pcVar10[uVar23];
            uVar23 = uVar23 + 1;
          } while (((long)size_in / (long)iVar14 & 0xffffffffU) != uVar23);
        }
        uVar20 = uVar20 + 1;
        pcVar10 = pcVar10 + (c1 / c0) * lVar9;
        pcVar6 = pcVar6 + lVar9;
      } while (uVar20 != uVar2);
      uVar5 = uVar5 + 1;
      pcVar13 = pcVar13 + lVar9;
      pcVar15 = pcVar15 + iVar12;
    } while (uVar5 != (uVar17 & 0xffffffff));
    if (0 < iVar3) {
      iVar14 = 0;
      do {
        iVar18 = ((iVar14 * iVar12) / iVar16) * c1 + (iVar1 - iVar1 % c1) * iVar21 + iVar1 % c1;
        iVar18 = iVar18 % c0 + (iVar18 / (iVar21 * c0)) * c0;
        if (row_m == 0) {
          if (ndim < 1) goto LAB_001021e0;
          uVar17 = 0;
          iVar4 = 0;
          do {
            iVar11 = iVar18;
            if (uVar8 != uVar17) {
              iVar11 = pidx[uVar17];
            }
            iVar4 = iVar4 * pdim[uVar17] + iVar11;
            uVar17 = uVar17 + 1;
          } while (uVar22 != uVar17);
        }
        else if (ndim < 1) {
LAB_001021e0:
          iVar4 = 0;
        }
        else {
          iVar4 = 0;
          lVar9 = uVar22 + 1;
          do {
            iVar11 = iVar18;
            if (lVar9 - uVar8 != 2) {
              iVar11 = pidx[lVar9 + -2];
            }
            iVar4 = iVar4 * pdim[lVar9 + -2] + iVar11;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
        iVar18 = proc_map[iVar4];
        dfft_nrecv[iVar18] = iVar12 * 8;
        dfft_offset_recv[iVar18] = iVar14 * iVar12 * 8;
        iVar14 = iVar14 + 1;
      } while (iVar14 != iVar3);
    }
  }
  MPI_Barrier(comm);
  MPI_Alltoallv(scratch,dfft_nsend,dfft_offset_send,&ompi_mpi_byte,work,dfft_nrecv,dfft_offset_recv,
                &ompi_mpi_byte,comm);
  return;
}

Assistant:

void dfft_redistribute_block_to_cyclic_1d(
                  int *dim,
                  int *pdim,
                  int ndim,
                  int current_dim,
                  int c0,
                  int c1,
                  int* pidx,
                  int size_in,
                  int *embed,
                  cpx_t *work,
                  cpx_t *scratch,
                  int *dfft_nsend,
                  int *dfft_nrecv,
                  int *dfft_offset_send,
                  int *dfft_offset_recv,
                  MPI_Comm comm,
                  int *proc_map,
                  int row_m)
    {
    /* exit early if nothing needs to be done */
    if (c0 == c1) return;

    int length = dim[current_dim]/pdim[current_dim];

    /* compute stride for column major matrix storage */
    int stride = size_in/embed[current_dim];

    /* processor index along current dimension */
    int s = pidx[current_dim];
    int p = pdim[current_dim];

    int ratio = c1/c0;
    int size = ((length/ratio > 1) ? (length/ratio) : 1);
    int npackets = length/size;
    size *= stride;

    int pdim_tot=1;
    int k;
    for (k = 0; k < ndim; ++k)
        pdim_tot *= pdim[k];

    int t;
    for (t = 0; t<pdim_tot; ++t)
        {
        dfft_nsend[t] = 0;
        dfft_nrecv[t] = 0;
        dfft_offset_send[t] = 0;
        dfft_offset_recv[t] = 0;
        }

    int j0;
    int j2;

    j0 = s % c0;
    j2 = s / c0;

    /* initialize send offsets and pack data */
    int j;
    #pragma omp parallel for private(j,k)
    for (j = 0; j < npackets; ++j)
        {
        int offset = j*size;
        int jglob = j2*c0*length + j * c0 + j0;
        int desti = (jglob/(c1*length))*c1+ jglob%c1;
        int destproc = 0;
        if (row_m)
            {
            for (k = ndim-1; k >=0 ;--k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? desti : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? desti : pidx[k]);
                }
            }

        int rank = proc_map[destproc];
        dfft_nsend[rank] = size*sizeof(cpx_t);
        dfft_offset_send[rank] = offset*sizeof(cpx_t);
        int r;
        for(r=0; r< (size/stride); r++)
            for (k=0; k < stride; k++)
               scratch[offset + r*stride+k]=  work[(j+r*ratio)*stride+k];
        }

    /* initialize recv offsets */
    int offset = 0;
    j0 = s % c1;
    j2 = s/c1;

    int r;
    for (r = 0; r < npackets; ++r)
        {
        offset = r*size;
        j = r*size/stride;
        int jglob = j2*c1*length+ j * c1 + j0;
        int srci = (jglob/(c0*length))*c0+jglob%c0;
        int srcproc = 0;
        int k;
        if (row_m)
            {
            for (k = ndim-1; k >= 0; --k)
                {
                srcproc *= pdim[k];
                srcproc += ((current_dim == k) ? srci : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                srcproc *= pdim[k];
                srcproc += ((current_dim == k) ? srci : pidx[k]);
                }
            }

        int rank = proc_map[srcproc];

        dfft_nrecv[rank] = size*sizeof(cpx_t);
        dfft_offset_recv[rank] = offset*sizeof(cpx_t);
        }

    /* synchronize */
    MPI_Barrier(comm);

    /* communicate */
    MPI_Alltoallv(scratch,dfft_nsend, dfft_offset_send, MPI_BYTE,
                  work, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                  comm);
    }